

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::ParseProtoFields
          (Parser *this,StructDef *struct_def,bool isextend,bool inside_oneof)

{
  size_type *input;
  int iVar1;
  bool bVar2;
  FieldDef *pFVar3;
  bool bVar4;
  bool bVar5;
  Value *this_00;
  char *pcVar6;
  undefined7 in_register_00000011;
  string *psVar7;
  CheckedError *ce;
  bool bVar8;
  ulong uVar9;
  int t;
  char in_R8B;
  byte bVar10;
  _Alloc_hider _Var11;
  allocator<char> local_2b1;
  FieldDef *field;
  voffset_t attribute;
  int iStack_2a4;
  undefined2 uStack_2a0;
  undefined6 uStack_29e;
  undefined2 uStack_298;
  undefined6 uStack_296;
  undefined2 uStack_290;
  string val;
  EnumDef *oneof_union;
  string name;
  StructDef *anonymous_struct;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  field_comment;
  string proto_field_id;
  string local_1d8 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name_1;
  
  psVar7 = (string *)CONCAT71(in_register_00000011,isextend);
  t = (int)struct_def;
  Expect(this,t);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    CheckedError::~CheckedError((CheckedError *)this);
    input = &(struct_def->super_Definition).file._M_string_length;
LAB_001161d3:
    do {
      if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x7d) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
        }
        break;
      }
      bVar4 = IsIdent((Parser *)struct_def,"message");
      if (((bVar4) || (bVar4 = IsIdent((Parser *)struct_def,"extend"), bVar4)) ||
         (bVar4 = IsIdent((Parser *)struct_def,"enum"), bVar4)) {
        ParseProtoDecl(this);
        goto LAB_00116222;
      }
      bVar4 = IsIdent((Parser *)struct_def,"extensions");
      if (bVar4) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x104) {
LAB_001162fb:
              Expect(this,t);
              goto LAB_00116222;
            }
            Next(this);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              CheckedError::~CheckedError((CheckedError *)this);
              Next(this);
              goto LAB_001162e6;
            }
          }
        }
        break;
      }
      bVar4 = IsIdent((Parser *)struct_def,"option");
      if (bVar4) {
        ParseProtoOption(this);
LAB_001162e6:
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          goto LAB_001162fb;
        }
        break;
      }
      bVar4 = IsIdent((Parser *)struct_def,"reserved");
      if (bVar4) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          bVar10 = 0;
          uVar9 = 0;
          do {
            CheckedError::~CheckedError((CheckedError *)this);
            iVar1 = *(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc);
            if (iVar1 == 0x102) {
              _attribute = (FieldDef *)((ulong)_attribute & 0xffffffffffff0000);
              bVar4 = StringToNumber<unsigned_short>((char *)*input,&attribute);
              if (!bVar4) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&name_1,"Protobuf has non positive number in reserved ids",
                           (allocator<char> *)&name);
                Error(this,(string *)struct_def);
                std::__cxx11::string::~string((string *)&name_1);
                break;
              }
              if (bVar10 == 0) {
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                           &psVar7[9].field_2,&attribute);
                uVar9 = (ulong)_attribute & 0xffff;
                bVar10 = 0;
              }
              else {
                while( true ) {
                  name_1._M_dataplus._M_p._0_2_ = (short)uVar9 + 1;
                  if (attribute < (ushort)name_1._M_dataplus._M_p) break;
                  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                             &psVar7[9].field_2,(value_type_conflict2 *)&name_1);
                  uVar9 = (ulong)(ushort)name_1._M_dataplus._M_p;
                }
                bVar10 = 0;
                uVar9 = (ulong)_attribute & 0xffff;
              }
            }
            else if (iVar1 == 0x3b) goto LAB_001164a3;
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)input,"to");
            Next(this);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
            bVar10 = bVar4 | bVar10;
          } while( true );
        }
        break;
      }
      bVar4 = IsIdent((Parser *)struct_def,"map");
      if (bVar4) {
        ParseProtoMapField(this,struct_def);
        goto LAB_00116222;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&field_comment,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&(struct_def->super_Definition).doc_comment.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      if (in_R8B == '\0') {
        bVar4 = IsIdent((Parser *)struct_def,"optional");
        if (bVar4) {
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            bVar2 = true;
LAB_001164ea:
            bVar4 = false;
            bVar8 = false;
LAB_001164f4:
            CheckedError::~CheckedError((CheckedError *)this);
            goto LAB_00116504;
          }
        }
        else {
          bVar4 = IsIdent((Parser *)struct_def,"required");
          if (bVar4) {
            Next(this);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              bVar2 = false;
              goto LAB_001164ea;
            }
          }
          else {
            bVar4 = IsIdent((Parser *)struct_def,"repeated");
            if (bVar4) {
              Next(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                bVar2 = true;
                bVar8 = false;
                bVar4 = true;
                goto LAB_001164f4;
              }
            }
            else {
              bVar4 = IsIdent((Parser *)struct_def,"oneof");
              if (!bVar4) {
                bVar2 = true;
                bVar4 = false;
                bVar8 = false;
                goto LAB_00116504;
              }
              Next(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                bVar2 = true;
                bVar4 = false;
                bVar8 = true;
                goto LAB_001164f4;
              }
            }
          }
        }
LAB_00116f11:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&field_comment);
        break;
      }
      bVar2 = true;
      bVar4 = false;
      bVar8 = false;
LAB_00116504:
      uStack_298 = 0;
      uStack_296 = 0;
      uStack_290 = 0;
      _attribute = (FieldDef *)0x0;
      uStack_2a0 = 0;
      uStack_29e = 0;
      bVar5 = IsIdent((Parser *)struct_def,"group");
      if ((bVar8) || (bVar5)) {
        if (bVar8) {
          if (*(char *)((long)&struct_def[3].super_Definition.file._M_dataplus._M_p + 2) != '\x01')
          goto LAB_00116624;
          ConvertCase(&name,(string *)input,kUpperCamel,kSnake);
          std::operator+(&name_1,&name,"Union");
          std::__cxx11::string::~string((string *)&name);
          StartEnum(this,(string *)struct_def,SUB81(&name_1,0),(EnumDef **)0x1);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            _attribute = (FieldDef *)0x10;
            goto LAB_001166ad;
          }
        }
        else {
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116f11;
          CheckedError::~CheckedError((CheckedError *)this);
LAB_00116624:
          iVar1 = *(int *)&struct_def[5].fixed;
          *(int *)&struct_def[5].fixed = iVar1 + 1;
          NumToString<int>(&name,iVar1);
          std::operator+(&name_1,"Anonymous",&name);
          std::__cxx11::string::~string((string *)&name);
          StartStruct(this,(string *)struct_def,(StructDef **)&name_1);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            _attribute = (FieldDef *)0xf;
LAB_001166ad:
            uStack_296 = 0;
            uStack_298 = 0;
            uStack_29e = 0;
            uStack_2a0 = 0;
            uStack_290 = 0;
            std::__cxx11::string::~string((string *)&name_1);
            goto LAB_001166bb;
          }
        }
        psVar7 = &name_1;
LAB_00116f0c:
        std::__cxx11::string::~string((string *)psVar7);
        goto LAB_00116f11;
      }
      ParseTypeFromProtoType(this,(Type *)struct_def);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116f11;
      CheckedError::~CheckedError((CheckedError *)this);
LAB_001166bb:
      if (bVar4) {
        iVar1 = _attribute;
        _attribute = (FieldDef *)CONCAT44(_attribute,0xe);
        if (iVar1 == 0xe) {
          _attribute = (FieldDef *)0xd0000000e;
        }
      }
      std::__cxx11::string::string((string *)&name,(string *)input);
      Expect(this,t);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') {
LAB_00116efa:
        psVar7 = &name;
        goto LAB_00116f0c;
      }
      CheckedError::~CheckedError((CheckedError *)this);
      proto_field_id._M_dataplus._M_p = (pointer)&proto_field_id.field_2;
      proto_field_id._M_string_length = 0;
      proto_field_id.field_2._M_local_buf[0] = '\0';
      if (!bVar8) {
        Expect(this,t);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          std::__cxx11::string::_M_assign((string *)&proto_field_id);
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            goto LAB_00116798;
          }
        }
        std::__cxx11::string::~string((string *)&proto_field_id);
        goto LAB_00116efa;
      }
LAB_00116798:
      field = (FieldDef *)0x0;
      if ((inside_oneof) &&
         (field = SymbolTable<flatbuffers::FieldDef>::Lookup
                            ((SymbolTable<flatbuffers::FieldDef> *)&psVar7[6]._M_string_length,&name
                            ), field != (FieldDef *)0x0)) {
LAB_0011680c:
        pFVar3 = field;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&(field->super_Definition).doc_comment,&field_comment);
        if (!(bool)(~bVar8 & proto_field_id._M_string_length == 0)) {
          this_00 = (Value *)operator_new(0x48);
          Value::Value(this_00);
          std::__cxx11::string::_M_assign((string *)&this_00->constant);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&name_1,"id",(allocator<char> *)&val);
          SymbolTable<flatbuffers::Value>::Add
                    (&(pFVar3->super_Definition).attributes,&name_1,this_00);
          std::__cxx11::string::~string((string *)&name_1);
        }
        if (!bVar2 && 0xb < _attribute - 1U) {
          pFVar3->presence = kRequired;
        }
        if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x5b) {
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          bVar4 = true;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            while( true ) {
              std::__cxx11::string::string((string *)&name_1,(string *)input);
              ParseProtoKey(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
              CheckedError::~CheckedError((CheckedError *)this);
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
              CheckedError::~CheckedError((CheckedError *)this);
              std::__cxx11::string::string((string *)&val,(string *)input);
              ParseProtoCurliesOrIdent(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') {
LAB_00116b71:
                std::__cxx11::string::~string((string *)&val);
                break;
              }
              CheckedError::~CheckedError((CheckedError *)this);
              bVar4 = std::operator==(&name_1,"default");
              _Var11 = val._M_dataplus;
              if (bVar4) {
                pcVar6 = strpbrk(val._M_dataplus._M_p,"0123456789-+.");
                if (_attribute - 0xbU < 2) {
                  bVar4 = std::operator==(&val,"inf");
                  if (((bVar4) || (bVar4 = std::operator==(&val,"+inf"), bVar4)) ||
                     (bVar4 = std::operator==(&val,"-inf"), bVar4)) {
                    bVar4 = std::operator==(&val,"inf");
                    if (bVar4) {
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_1d8,"+inf",&local_2b1);
                    }
                    else {
                      std::__cxx11::string::string(local_1d8,(string *)&val);
                    }
                    std::__cxx11::string::operator=((string *)&(field->value).constant,local_1d8);
                    std::__cxx11::string::~string(local_1d8);
                    goto LAB_00116ab0;
                  }
                  _Var11 = val._M_dataplus;
                }
                if (((_attribute - 1U < 0xc) && (pcVar6 == _Var11._M_p)) ||
                   (bVar4 = std::operator==(&val,"true"), bVar4)) {
                  std::__cxx11::string::_M_assign((string *)&(field->value).constant);
                }
              }
              else {
                bVar4 = std::operator==(&name_1,"deprecated");
                if (bVar4) {
                  bVar4 = std::operator==(&val,"true");
                  field->deprecated = bVar4;
                }
              }
LAB_00116ab0:
              if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x2c) {
                std::__cxx11::string::~string((string *)&val);
                std::__cxx11::string::~string((string *)&name_1);
                Expect(this,t);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                bVar4 = true;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116e4f;
                CheckedError::~CheckedError((CheckedError *)this);
                goto LAB_00116bd8;
              }
              Next(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116b71;
              CheckedError::~CheckedError((CheckedError *)this);
              std::__cxx11::string::~string((string *)&val);
              std::__cxx11::string::~string((string *)&name_1);
            }
            std::__cxx11::string::~string((string *)&name_1);
            bVar4 = true;
          }
        }
        else {
LAB_00116bd8:
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          bVar4 = true;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            bVar4 = false;
          }
        }
      }
      else {
        AddField(this,struct_def,psVar7,(Type *)&name,(FieldDef **)&attribute);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        bVar4 = true;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          goto LAB_0011680c;
        }
      }
LAB_00116e4f:
      std::__cxx11::string::~string((string *)&proto_field_id);
      std::__cxx11::string::~string((string *)&name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&field_comment);
    } while (!bVar4);
  }
LAB_00116183:
  return SUB82(this,0);
LAB_001164a3:
  Next(this);
LAB_00116222:
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116183;
  CheckedError::~CheckedError((CheckedError *)this);
  goto LAB_001161d3;
}

Assistant:

CheckedError Parser::ParseProtoFields(StructDef *struct_def, bool isextend,
                                      bool inside_oneof) {
  EXPECT('{');
  while (token_ != '}') {
    if (IsIdent("message") || IsIdent("extend") || IsIdent("enum")) {
      // Nested declarations.
      ECHECK(ParseProtoDecl());
    } else if (IsIdent("extensions")) {  // Skip these.
      NEXT();
      EXPECT(kTokenIntegerConstant);
      if (Is(kTokenIdentifier)) {
        NEXT();  // to
        NEXT();  // num
      }
      EXPECT(';');
    } else if (IsIdent("option")) {  // Skip these.
      ECHECK(ParseProtoOption());
      EXPECT(';');
    } else if (IsIdent("reserved")) {  // Skip these.
      /**
       * Reserved proto ids can be comma seperated (e.g. 1,2,4,5;)
       * or range based (e.g. 9 to 11;)
       * or combination of them (e.g. 1,2,9 to 11,4,5;)
       * It will be ended by a semicolon.
       */
      NEXT();
      bool range = false;
      voffset_t from = 0;

      while (!Is(';')) {
        if (token_ == kTokenIntegerConstant) {
          voffset_t attribute = 0;
          bool done = StringToNumber(attribute_.c_str(), &attribute);
          if (!done)
            return Error("Protobuf has non positive number in reserved ids");

          if (range) {
            for (voffset_t id = from + 1; id <= attribute; id++)
              struct_def->reserved_ids.push_back(id);

            range = false;
          } else {
            struct_def->reserved_ids.push_back(attribute);
          }

          from = attribute;
        }

        if (attribute_ == "to") range = true;

        NEXT();
      }  // A variety of formats, just skip.

      NEXT();
    } else if (IsIdent("map")) {
      ECHECK(ParseProtoMapField(struct_def));
    } else {
      std::vector<std::string> field_comment = doc_comment_;
      // Parse the qualifier.
      bool required = false;
      bool repeated = false;
      bool oneof = false;
      if (!inside_oneof) {
        if (IsIdent("optional")) {
          // This is the default.
          NEXT();
        } else if (IsIdent("required")) {
          required = true;
          NEXT();
        } else if (IsIdent("repeated")) {
          repeated = true;
          NEXT();
        } else if (IsIdent("oneof")) {
          oneof = true;
          NEXT();
        } else {
          // can't error, proto3 allows decls without any of the above.
        }
      }
      StructDef *anonymous_struct = nullptr;
      EnumDef *oneof_union = nullptr;
      Type type;
      if (IsIdent("group") || oneof) {
        if (!oneof) NEXT();
        if (oneof && opts.proto_oneof_union) {
          auto name = ConvertCase(attribute_, Case::kUpperCamel) + "Union";
          ECHECK(StartEnum(name, true, &oneof_union));
          type = Type(BASE_TYPE_UNION, nullptr, oneof_union);
        } else {
          auto name = "Anonymous" + NumToString(anonymous_counter_++);
          ECHECK(StartStruct(name, &anonymous_struct));
          type = Type(BASE_TYPE_STRUCT, anonymous_struct);
        }
      } else {
        ECHECK(ParseTypeFromProtoType(&type));
      }
      // Repeated elements get mapped to a vector.
      if (repeated) {
        type.element = type.base_type;
        type.base_type = BASE_TYPE_VECTOR;
        if (type.element == BASE_TYPE_VECTOR) {
          // We have a vector or vectors, which FlatBuffers doesn't support.
          // For now make it a vector of string (since the source is likely
          // "repeated bytes").
          // TODO(wvo): A better solution would be to wrap this in a table.
          type.element = BASE_TYPE_STRING;
        }
      }
      std::string name = attribute_;
      EXPECT(kTokenIdentifier);
      std::string proto_field_id;
      if (!oneof) {
        // Parse the field id. Since we're just translating schemas, not
        // any kind of binary compatibility, we can safely ignore these, and
        // assign our own.
        EXPECT('=');
        proto_field_id = attribute_;
        EXPECT(kTokenIntegerConstant);
      }
      FieldDef *field = nullptr;
      if (isextend) {
        // We allow a field to be re-defined when extending.
        // TODO: are there situations where that is problematic?
        field = struct_def->fields.Lookup(name);
      }
      if (!field) ECHECK(AddField(*struct_def, name, type, &field));
      field->doc_comment = field_comment;
      if (!proto_field_id.empty() || oneof) {
        auto val = new Value();
        val->constant = proto_field_id;
        field->attributes.Add("id", val);
      }
      if (!IsScalar(type.base_type) && required) {
        field->presence = FieldDef::kRequired;
      }
      // See if there's a default specified.
      if (Is('[')) {
        NEXT();
        for (;;) {
          auto key = attribute_;
          ECHECK(ParseProtoKey());
          EXPECT('=');
          auto val = attribute_;
          ECHECK(ParseProtoCurliesOrIdent());
          if (key == "default") {
            // Temp: skip non-numeric and non-boolean defaults (enums).
            auto numeric = strpbrk(val.c_str(), "0123456789-+.");
            if (IsFloat(type.base_type) &&
                (val == "inf" || val == "+inf" || val == "-inf")) {
              // Prefer to be explicit with +inf.
              field->value.constant = val == "inf" ? "+inf" : val;
            } else if (IsScalar(type.base_type) && numeric == val.c_str()) {
              field->value.constant = val;
            } else if (val == "true") {
              field->value.constant = val;
            }  // "false" is default, no need to handle explicitly.
          } else if (key == "deprecated") {
            field->deprecated = val == "true";
          }
          if (!Is(',')) break;
          NEXT();
        }
        EXPECT(']');
      }
      if (anonymous_struct) {
        ECHECK(ParseProtoFields(anonymous_struct, false, oneof));
        if (Is(';')) NEXT();
      } else if (oneof_union) {
        // Parse into a temporary StructDef, then transfer fields into an
        // EnumDef describing the oneof as a union.
        StructDef oneof_struct;
        ECHECK(ParseProtoFields(&oneof_struct, false, oneof));
        if (Is(';')) NEXT();
        for (auto field_it = oneof_struct.fields.vec.begin();
             field_it != oneof_struct.fields.vec.end(); ++field_it) {
          const auto &oneof_field = **field_it;
          const auto &oneof_type = oneof_field.value.type;
          if (oneof_type.base_type != BASE_TYPE_STRUCT ||
              !oneof_type.struct_def || oneof_type.struct_def->fixed)
            return Error("oneof '" + name +
                         "' cannot be mapped to a union because member '" +
                         oneof_field.name + "' is not a table type.");
          EnumValBuilder evb(*this, *oneof_union);
          auto ev = evb.CreateEnumerator(oneof_type.struct_def->name);
          ev->union_type = oneof_type;
          ev->doc_comment = oneof_field.doc_comment;
          ECHECK(evb.AcceptEnumerator(oneof_field.name));
        }
      } else {
        EXPECT(';');
      }
    }
  }
  NEXT();
  return NoError();
}